

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O2

int Intp_ManProcessRoots(Intp_Man_t *p)

{
  Sto_Man_t *pSVar1;
  uint uVar2;
  Sto_Cls_t *pSVar3;
  int iVar4;
  Sto_Cls_t *pSVar5;
  
  pSVar1 = p->pCnf;
  pSVar3 = (Sto_Cls_t *)&pSVar1->pHead;
  iVar4 = 0;
  pSVar5 = pSVar3;
  while (pSVar5 = pSVar5->pNext, pSVar5 != (Sto_Cls_t *)0x0) {
    if (((pSVar1->nClausesA <= iVar4 ^ (byte)*(uint *)&pSVar5->field_0x1c) & 1) == 0) {
      __assert_fail("(int)pClause->fA == (Counter < (int)p->pCnf->nClausesA)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                    ,0x317,"int Intp_ManProcessRoots(Intp_Man_t *)");
    }
    if (((*(uint *)&pSVar5->field_0x1c & 2) == 0) == iVar4 < pSVar1->nRoots) {
      __assert_fail("(int)pClause->fRoot == (Counter < (int)p->pCnf->nRoots)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                    ,0x318,"int Intp_ManProcessRoots(Intp_Man_t *)");
    }
    iVar4 = iVar4 + 1;
  }
  if (pSVar1->nClauses != iVar4) {
    __assert_fail("p->pCnf->nClauses == Counter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                  ,0x31b,"int Intp_ManProcessRoots(Intp_Man_t *)");
  }
  if ((*(uint *)&pSVar1->pTail->field_0x1c & 0x7fffff8) != 0) {
    __assert_fail("p->pCnf->pTail->nLits == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                  ,0x31e,"int Intp_ManProcessRoots(Intp_Man_t *)");
  }
  p->nTrailSize = 0;
  do {
    do {
      pSVar3 = pSVar3->pNext;
      if ((pSVar3 == (Sto_Cls_t *)0x0) || (uVar2 = *(uint *)&pSVar3->field_0x1c, (uVar2 & 2) == 0))
      {
        pSVar3 = Intp_ManPropagate(p,0);
        if (pSVar3 == (Sto_Cls_t *)0x0) {
          p->nRootSize = p->nTrailSize;
          return 1;
        }
        Intp_ManProofTraceOne(p,pSVar3,p->pCnf->pEmpty);
        goto LAB_0071d71a;
      }
      if ((uVar2 & 0x7fffff0) != 0) {
        Intp_ManWatchClause(p,pSVar3,*(lit *)&pSVar3[1].pNext);
        Intp_ManWatchClause(p,pSVar3,*(lit *)((long)&pSVar3[1].pNext + 4));
        uVar2 = *(uint *)&pSVar3->field_0x1c;
      }
    } while ((uVar2 & 0x7fffff8) != 8);
    uVar2 = *(uint *)&pSVar3[1].pNext;
    if (((int)uVar2 < 0) || (p->pCnf->nVars <= (int)(uVar2 >> 1))) {
      __assert_fail("lit_check(pClause->pLits[0], p->pCnf->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satInterP.c"
                    ,0x32e,"int Intp_ManProcessRoots(Intp_Man_t *)");
    }
    iVar4 = Intp_ManEnqueue(p,uVar2,pSVar3);
  } while (iVar4 != 0);
  Intp_ManProofTraceOne(p,pSVar3,p->pCnf->pEmpty);
LAB_0071d71a:
  if (p->fVerbose != 0) {
    puts("Found root level conflict!");
  }
  return 0;
}

Assistant:

int Intp_ManProcessRoots( Intp_Man_t * p )
{
    Sto_Cls_t * pClause;
    int Counter;

    // make sure the root clauses are preceeding the learnt clauses
    Counter = 0;
    Sto_ManForEachClause( p->pCnf, pClause )
    {
        assert( (int)pClause->fA    == (Counter < (int)p->pCnf->nClausesA) );
        assert( (int)pClause->fRoot == (Counter < (int)p->pCnf->nRoots)    );
        Counter++;
    }
    assert( p->pCnf->nClauses == Counter );

    // make sure the last clause if empty
    assert( p->pCnf->pTail->nLits == 0 );

    // go through the root unit clauses
    p->nTrailSize = 0;
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        // create watcher lists for the root clauses
        if ( pClause->nLits > 1 )
        {
            Intp_ManWatchClause( p, pClause, pClause->pLits[0] );
            Intp_ManWatchClause( p, pClause, pClause->pLits[1] );
        }
        // empty clause and large clauses
        if ( pClause->nLits != 1 )
            continue;
        // unit clause
        assert( lit_check(pClause->pLits[0], p->pCnf->nVars) );
        if ( !Intp_ManEnqueue( p, pClause->pLits[0], pClause ) )
        {
            // detected root level conflict
//            printf( "Error in Intp_ManProcessRoots(): Detected a root-level conflict too early!\n" );
//            assert( 0 );
            // detected root level conflict
            Intp_ManProofTraceOne( p, pClause, p->pCnf->pEmpty );
            if ( p->fVerbose )
                printf( "Found root level conflict!\n" );
            return 0;
        }
    }

    // propagate the root unit clauses
    pClause = Intp_ManPropagate( p, 0 );
    if ( pClause )
    {
        // detected root level conflict
        Intp_ManProofTraceOne( p, pClause, p->pCnf->pEmpty );
        if ( p->fVerbose )
            printf( "Found root level conflict!\n" );
        return 0;
    }

    // set the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}